

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

bool EqualNode::ParameterToLong(char *param,long *outResult)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  int __base;
  char *pEnd;
  char *local_30;
  
  cVar1 = *param;
  if (cVar1 == '0') {
    if ((param[1] != 'b') && (__base = 0, param[1] != 'B')) goto LAB_003aef7c;
    param = param + 2;
  }
  else {
    if (cVar1 == '-') {
      if (param[1] != '0') goto LAB_003aef65;
      cVar2 = param[2];
joined_r0x003aef63:
      if (cVar2 != 'b') goto LAB_003aef65;
    }
    else {
      __base = 0;
      if (cVar1 != '+') goto LAB_003aef7c;
      if (param[1] == '0') {
        cVar2 = param[2];
        goto joined_r0x003aef63;
      }
LAB_003aef65:
      __base = 0;
      if ((param[1] != '0') || (__base = 0, param[2] != 'B')) goto LAB_003aef7c;
    }
    param = param + 3;
  }
  __base = 2;
LAB_003aef7c:
  lVar4 = strtol(param,&local_30,__base);
  if (((local_30 == param) || (*local_30 != '\0')) || (piVar5 = __errno_location(), *piVar5 == 0x22)
     ) {
    bVar3 = false;
  }
  else {
    lVar6 = -lVar4;
    if (lVar4 < 1) {
      lVar6 = lVar4;
    }
    if (cVar1 != '-') {
      lVar6 = lVar4;
    }
    *outResult = lVar6;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

static bool ParameterToLong(const char* param, long* outResult)
  {
    const char isNegative = param[0] == '-';

    int base = 0;
    if (cmHasLiteralPrefix(param, "0b") || cmHasLiteralPrefix(param, "0B")) {
      base = 2;
      param += 2;
    } else if (cmHasLiteralPrefix(param, "-0b") ||
               cmHasLiteralPrefix(param, "-0B") ||
               cmHasLiteralPrefix(param, "+0b") ||
               cmHasLiteralPrefix(param, "+0B")) {
      base = 2;
      param += 3;
    }

    char* pEnd;
    long result = strtol(param, &pEnd, base);
    if (pEnd == param || *pEnd != '\0' || errno == ERANGE) {
      return false;
    }
    if (isNegative && result > 0) {
      result *= -1;
    }
    *outResult = result;
    return true;
  }